

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O1

void __thiscall StatsObserver::update(StatsObserver *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  GameLoop *pGVar5;
  ostream *poVar6;
  
  pvVar2 = this->subject->pOwnedCountries;
  ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar4 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pGVar5 = GameLoop::getInstance();
  pvVar2 = pGVar5->gameMap->pMapCountries;
  if ((long)ppCVar3 - (long)ppCVar4 !=
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    printTable();
    return;
  }
  iVar1 = *this->subject->pPlayerId;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1m\x1b[33m",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," owns all of the countries! They have won the game!!",0x34);
  return;
}

Assistant:

void StatsObserver::update() {
    bool gameDone = false;
    int playerId = 0;

    if (this->subject->getOwnedCountries()->size() ==
        GameLoop::getInstance()->getGameMap()->getMapCountries()->size()) {
        gameDone = true;
        playerId = this->subject->getPlayerId();
    }
    if (gameDone) {
        cout << "\033[1m\033[33m";
        std::cout << "Player " << playerId << " owns all of the countries! They have won the game!!";
    } else {
        StatsObserver::printTable();
    }
}